

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O0

void __thiscall QMainWindowLayout::revert(QMainWindowLayout *this,QLayoutItem *widgetItem)

{
  long lVar1;
  bool bVar2;
  int extraout_var;
  QMainWindowLayoutState *in_RSI;
  QMainWindowLayoutState *in_RDI;
  long in_FS_OFFSET;
  QRect QVar3;
  QWidget *widget;
  QLayoutItem *in_stack_00000040;
  QMainWindowLayout *in_stack_00000048;
  QMainWindowLayoutState *in_stack_ffffffffffffffa8;
  int dockPos;
  QMainWindowLayoutState *item;
  undefined1 in_stack_ffffffffffffffd0 [16];
  QMainWindowLayoutState *in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QMainWindowLayoutState::isValid((QMainWindowLayoutState *)0x5f9e76);
  if (bVar2) {
    (**(code **)(*(long *)&in_RSI->rect + 0x68))();
    dockPos = extraout_var;
    QMainWindowLayoutState::operator=(in_RDI,in_stack_ffffffffffffffa8);
    QMainWindowLayoutState::indexOf(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd0._8_8_);
    QList<int>::operator=((QList<int> *)in_RDI,(QList<int> *)in_stack_ffffffffffffffa8);
    QList<int>::~QList((QList<int> *)0x5f9ee5);
    bVar2 = QList<int>::isEmpty((QList<int> *)0x5f9ef6);
    if (!bVar2) {
      item = in_RSI;
      QList<int>::at((QList<int> *)in_RDI,(qsizetype)in_RSI);
      fixToolBarOrientation((QLayoutItem *)item,dockPos);
      QMainWindowLayoutState::unplug
                (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd0._8_8_,
                 in_stack_ffffffffffffffd0._0_8_);
      QMainWindowLayoutState::fitLayout(in_RSI);
      QVar3 = QMainWindowLayoutState::itemRect
                        (in_stack_ffffffffffffffd0._8_8_,in_stack_ffffffffffffffd0._0_8_);
      in_RDI[2].dockAreaLayout.docks[0].sep = QVar3._0_8_;
      in_RDI[2].dockAreaLayout.docks[0].separatorWidgets.d.d = QVar3._8_8_;
      plug(in_stack_00000048,in_stack_00000040);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMainWindowLayout::revert(QLayoutItem *widgetItem)
{
    if (!savedState.isValid())
        return;

    QWidget *widget = widgetItem->widget();
    layoutState = savedState;
    currentGapPos = layoutState.indexOf(widget);
    if (currentGapPos.isEmpty())
        return;
    fixToolBarOrientation(widgetItem, currentGapPos.at(1));
    layoutState.unplug(currentGapPos);
    layoutState.fitLayout();
    currentGapRect = layoutState.itemRect(currentGapPos);

    plug(widgetItem);
}